

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

shared_ptr<Type> __thiscall SetElem::check(SetElem *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  shared_ptr<Type> sVar8;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar1 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar5 = false;
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p2;
  }
  else {
    auVar7 = __dynamic_cast(peVar1,&Type::typeinfo,&Array::typeinfo,0);
    bVar5 = auVar7._0_8_ != 0;
    _Var4._M_pi = auVar7._8_8_;
  }
  peVar2 = in_RCX->_M_ptr;
  if (peVar2 == (element_type *)0x0) {
    bVar6 = false;
  }
  else {
    auVar7 = __dynamic_cast(peVar2,&Type::typeinfo,&Array::typeinfo,0);
    _Var4._M_pi = auVar7._8_8_;
    bVar6 = auVar7._0_8_ != 0;
  }
  if (!(bool)(bVar5 | bVar6)) {
    if (peVar1 == peVar2) {
      (this->super_Stmt).super_Node._vptr_Node = (_func_int **)peVar2;
      p_Var3 = (in_RCX->_M_refcount)._M_pi;
      (in_RCX->_M_refcount)._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Stmt).super_Node.lexline =
           p_Var3;
LAB_001151bb:
      in_RCX->_M_ptr = (element_type *)0x0;
      goto LAB_001151d1;
    }
    std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
    bVar5 = Type::numeric((shared_ptr<Type> *)&local_50);
    if (bVar5) {
      std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,in_RCX);
      bVar5 = Type::numeric((shared_ptr<Type> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      _Var4._M_pi = extraout_RDX;
      if (bVar5) {
        p_Var3 = (in_RCX->_M_refcount)._M_pi;
        (in_RCX->_M_refcount)._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_Stmt).super_Node._vptr_Node = (_func_int **)in_RCX->_M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Stmt).super_Node.lexline =
             p_Var3;
        goto LAB_001151bb;
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Stmt).super_Node.lexline = 0;
LAB_001151d1:
  sVar8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar8.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return p2;
		else if (Type::numeric(p1) && Type::numeric(p2)) return p2;
		else return nullptr;
	}